

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

uint Curl_sasl_decode_mech(char *ptr,size_t maxlen,size_t *len)

{
  byte bVar1;
  size_t __n;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  
  lVar4 = 0x10;
  do {
    if ((int)lVar4 == 0xd0) {
      return 0;
    }
    __n = *(size_t *)(&UNK_00692918 + lVar4);
    if ((__n <= maxlen) &&
       (iVar2 = bcmp(ptr,*(void **)((long)&Curl_handler_gopher.protocol + lVar4),__n), iVar2 == 0))
    {
      if (len != (size_t *)0x0) {
        *len = __n;
      }
      if (__n == maxlen) {
LAB_0051ae47:
        return *(uint *)((long)&mechtable[0].name + lVar4);
      }
      bVar1 = ptr[__n];
      ppuVar3 = __ctype_b_loc();
      if (((((*ppuVar3)[bVar1] & 0x900) == 0) && (bVar1 != 0x5f)) && (bVar1 != 0x2d))
      goto LAB_0051ae47;
    }
    lVar4 = lVar4 + 0x18;
  } while( true );
}

Assistant:

unsigned int Curl_sasl_decode_mech(const char *ptr, size_t maxlen, size_t *len)
{
  unsigned int i;
  char c;

  for(i = 0; mechtable[i].name; i++) {
    if(maxlen >= mechtable[i].len &&
       !memcmp(ptr, mechtable[i].name, mechtable[i].len)) {
      if(len)
        *len = mechtable[i].len;

      if(maxlen == mechtable[i].len)
        return mechtable[i].bit;

      c = ptr[mechtable[i].len];
      if(!ISUPPER(c) && !ISDIGIT(c) && c != '-' && c != '_')
        return mechtable[i].bit;
    }
  }

  return 0;
}